

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O3

RationalNum operator+(RationalNum *left,RationalNum *right)

{
  RationalNum RVar1;
  long lVar2;
  longlong tempRD;
  longlong tempLD;
  long local_48;
  long local_40;
  RationalNum local_38;
  
  local_38.denominator = 1;
  local_40 = (long)(int)left->denominator;
  local_48 = (long)(int)right->denominator;
  simplifyFun(&local_40,&local_48);
  lVar2 = local_48;
  RationalNum::setDenominator(&local_38,(int)left->denominator * local_48);
  local_38.numerator = (int)right->numerator * local_40 + (int)left->numerator * lVar2;
  RationalNum::simplify(&local_38);
  RVar1.denominator = local_38.denominator;
  RVar1.numerator = local_38.numerator;
  return RVar1;
}

Assistant:

RationalNum operator+(const RationalNum &left, const RationalNum &right) {
    RationalNum temp;
    long long int tempLD = left.getDenominator();
    long long int tempRD = right.getDenominator();
    simplifyFun(tempLD, tempRD);
    temp.setDenominator(left.getDenominator() * tempRD);
    temp.setNumerator(left.getNumerator() * tempRD + right.getNumerator() * tempLD);
    temp.simplify();
    return temp;
}